

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::GetLabel(TypeChecker *this,Index depth,Label **out_label)

{
  size_type sVar1;
  reference pvVar2;
  Label **out_label_local;
  Index depth_local;
  TypeChecker *this_local;
  
  sVar1 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::size
                    (&this->label_stack_);
  if (depth < sVar1) {
    sVar1 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::size
                      (&this->label_stack_);
    pvVar2 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::
             operator[](&this->label_stack_,(sVar1 - depth) - 1);
    *out_label = pvVar2;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    sVar1 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::size
                      (&this->label_stack_);
    if (sVar1 == 0) {
      __assert_fail("label_stack_.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/type-checker.cc"
                    ,0x3f,"Result wabt::TypeChecker::GetLabel(Index, Label **)");
    }
    sVar1 = std::vector<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>::size
                      (&this->label_stack_);
    PrintError(this,"invalid depth: %u (max %zd)",(ulong)depth,sVar1 - 1);
    *out_label = (Label *)0x0;
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::GetLabel(Index depth, Label** out_label) {
  if (depth >= label_stack_.size()) {
    assert(label_stack_.size() > 0);
    PrintError("invalid depth: %" PRIindex " (max %" PRIzd ")", depth,
               label_stack_.size() - 1);
    *out_label = nullptr;
    return Result::Error;
  }
  *out_label = &label_stack_[label_stack_.size() - depth - 1];
  return Result::Ok;
}